

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall
QStyleSheetStyle::renderMenuItemIcon
          (QStyleSheetStyle *this,QStyleOptionMenuItem *mi,QPainter *p,QWidget *w,QRect *rect,
          QRenderRule *subRule)

{
  QSharedDataPointer<QStyleSheetGeometryData> *this_00;
  long lVar1;
  int iVar2;
  int iVar3;
  QStyleSheetGeometryData *pQVar4;
  long in_FS_OFFSET;
  qreal qVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  QPoint local_100;
  QRect local_f8;
  QSize local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined4 local_c8;
  undefined4 local_c4;
  QRenderRule iconRule;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = (**(code **)(*(long *)this + 0xe0))(this,0x3e,mi,w);
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_c4 = local_c8;
  qVar5 = QStyleHelper::getDpr(p);
  QIcon::pixmap(&local_e8,qVar5,(int)mi + 0x78,(State)&local_c8);
  iVar2 = QPixmap::width();
  uVar6 = QPixmap::devicePixelRatio();
  iVar3 = QPixmap::height();
  uVar7 = QPixmap::devicePixelRatio();
  auVar8._0_8_ = (double)iVar2;
  auVar8._8_8_ = (double)iVar3;
  auVar9._8_8_ = uVar7;
  auVar9._0_8_ = uVar6;
  auVar8 = divpd(auVar8,auVar9);
  iVar2 = (int)auVar8._0_8_;
  iVar3 = (int)auVar8._8_8_;
  memset(&iconRule,0xaa,0x88);
  renderRule(&iconRule,this,&w->super_QObject,&mi->super_QStyleOption,0x27);
  this_00 = &iconRule.geo;
  if (iconRule.geo.d.ptr == (QStyleSheetGeometryData *)0x0) {
    pQVar4 = (QStyleSheetGeometryData *)operator_new(0x1c);
    (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    pQVar4->minWidth = iVar2;
    pQVar4->minHeight = iVar3;
    pQVar4->width = iVar2;
    pQVar4->height = iVar3;
    pQVar4->maxWidth = -1;
    pQVar4->maxHeight = -1;
    QSharedDataPointer<QStyleSheetGeometryData>::reset(this_00,pQVar4);
  }
  else {
    pQVar4 = QSharedDataPointer<QStyleSheetGeometryData>::operator->(this_00);
    pQVar4->width = iVar2;
    pQVar4 = QSharedDataPointer<QStyleSheetGeometryData>::operator->(this_00);
    pQVar4->height = iVar3;
  }
  local_f8 = positionRect(this,w,subRule,&iconRule,0x27,rect,(mi->super_QStyleOption).direction);
  QRenderRule::drawRule(&iconRule,p,&local_f8);
  local_100.yp.m_i = (iVar3 + -1) / -2 + (int)(((long)local_f8.y2.m_i + (long)local_f8.y1.m_i) / 2);
  local_100.xp.m_i = (iVar2 + -1) / -2 + (int)(((long)local_f8.x2.m_i + (long)local_f8.x1.m_i) / 2);
  QPainter::drawPixmap(p,&local_100,(QPixmap *)&local_e8);
  QRenderRule::~QRenderRule(&iconRule);
  QPixmap::~QPixmap((QPixmap *)&local_e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::renderMenuItemIcon(const QStyleOptionMenuItem *mi, QPainter *p, const QWidget *w,
                                          const QRect &rect, QRenderRule &subRule) const
{
    const QIcon::Mode mode = mi->state & QStyle::State_Enabled
                           ? (mi->state & QStyle::State_Selected ? QIcon::Active : QIcon::Normal)
                           : QIcon::Disabled;
    const bool checked = mi->checkType != QStyleOptionMenuItem::NotCheckable && mi->checked;
    const auto iconSize = pixelMetric(PM_SmallIconSize, mi, w);
    const QSize sz(iconSize, iconSize);
    const QPixmap pixmap(mi->icon.pixmap(sz, QStyleHelper::getDpr(p), mode,
                        checked ? QIcon::On : QIcon::Off));
    const int pixw = pixmap.width() / pixmap.devicePixelRatio();
    const int pixh = pixmap.height() / pixmap.devicePixelRatio();
    QRenderRule iconRule = renderRule(w, mi, PseudoElement_MenuIcon);
    if (!iconRule.hasGeometry()) {
        iconRule.geo = new QStyleSheetGeometryData(pixw, pixh, pixw, pixh, -1, -1);
    } else {
        iconRule.geo->width = pixw;
        iconRule.geo->height = pixh;
    }
    QRect iconRect = positionRect(w, subRule, iconRule, PseudoElement_MenuIcon, rect, mi->direction);
    if (mi->direction == Qt::LeftToRight)
        iconRect.moveLeft(iconRect.left());
    else
        iconRect.moveRight(iconRect.right());
    iconRule.drawRule(p, iconRect);
    QRect pmr(0, 0, pixw, pixh);
    pmr.moveCenter(iconRect.center());
    p->drawPixmap(pmr.topLeft(), pixmap);
}